

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::SobolSampler::SobolSampler
          (SobolSampler *this,int samplesPerPixel,Point2i *fullResolution,
          RandomizeStrategy randomizeStrategy)

{
  int iVar1;
  int32_t iVar2;
  int v;
  int local_14;
  
  this->samplesPerPixel = samplesPerPixel;
  this->randomizeStrategy = randomizeStrategy;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  if (POPCOUNT(samplesPerPixel) != 1) {
    Warning<int&>("Non power-of-two sample count %d will perform sub-optimally with the SobolSampler."
                  ,&local_14);
  }
  iVar1 = (fullResolution->super_Tuple2<pbrt::Point2,_int>).x;
  v = (fullResolution->super_Tuple2<pbrt::Point2,_int>).y;
  if (v < iVar1) {
    v = iVar1;
  }
  iVar2 = RoundUpPow2(v);
  this->scale = iVar2;
  return;
}

Assistant:

SobolSampler(int samplesPerPixel, const Point2i &fullResolution,
                 RandomizeStrategy randomizeStrategy)
        : samplesPerPixel(samplesPerPixel), randomizeStrategy(randomizeStrategy) {
        if (!IsPowerOf2(samplesPerPixel))
            Warning("Non power-of-two sample count %d will perform sub-optimally with "
                    "the SobolSampler.",
                    samplesPerPixel);
        scale = RoundUpPow2(std::max(fullResolution.x, fullResolution.y));
    }